

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_setfuncs(lua_State *L,luaL_Reg *l,int nup)

{
  long lVar1;
  int in_EDX;
  lua_State *in_RSI;
  undefined8 in_RDI;
  int i;
  lua_State *in_stack_00000018;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  int local_18;
  
  luaL_checkstack(in_RSI,in_EDX,(char *)0x129987);
  for (; lVar1._0_4_ = in_RSI->nextgc, lVar1._4_1_ = in_RSI->marked, lVar1._5_1_ = in_RSI->gct,
      lVar1._6_1_ = in_RSI->dummy_ffid, lVar1._7_1_ = in_RSI->status, lVar1 != 0;
      in_RSI = (lua_State *)&in_RSI->base) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      lua_pushvalue((lua_State *)CONCAT44(nup,i),(int)((ulong)in_RDI >> 0x20));
    }
    lua_pushcclosure(in_stack_00000018,(lua_CFunction)L,l._4_4_);
    lua_setfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  lua_settop(in_RSI,in_EDX);
  return;
}

Assistant:

LUALIB_API void luaL_setfuncs(lua_State *L, const luaL_Reg *l, int nup)
{
  luaL_checkstack(L, nup, "too many upvalues");
  for (; l->name; l++) {
    int i;
    for (i = 0; i < nup; i++)  /* Copy upvalues to the top. */
      lua_pushvalue(L, -nup);
    lua_pushcclosure(L, l->func, nup);
    lua_setfield(L, -(nup + 2), l->name);
  }
  lua_pop(L, nup);  /* Remove upvalues. */
}